

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O0

void Centaurus::Stage3Runner::
     append_value<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *values_next_it,int n,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_> *this;
  bool bVar1;
  value_type vVar2;
  reference pvVar3;
  reference __args;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  StackEntryTag local_30;
  StackEntryTag local_2c;
  int i;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *tags_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *p_Stack_10;
  int n_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *values_next_it_local;
  
  _i = tags;
  tags_local = (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                *)values;
  values_local._4_4_ = n;
  p_Stack_10 = values_next_it;
  pvVar3 = std::
           vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ::back(tags);
  bVar1 = detail::isValueTag(*pvVar3);
  if (bVar1) {
    pvVar3 = std::
             vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             ::back(_i);
    vVar2 = *pvVar3 + values_local._4_4_;
    pvVar3 = std::
             vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             ::back(_i);
    *pvVar3 = vVar2;
  }
  else {
    local_2c = values_local._4_4_;
    std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    ::emplace_back<Centaurus::detail::StackEntryTag>(_i,&local_2c);
  }
  for (local_30 = END_MARKER; this = tags_local, local_30 < values_local._4_4_;
      local_30 = local_30 + VALUE) {
    local_38 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator++(p_Stack_10,0);
    __args = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_38);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,__args);
  }
  return;
}

Assistant:

static void append_value(Iterator& values_next_it, int n, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    if (detail::isValueTag(tags.back())) {
      tags.back() = static_cast<detail::StackEntryTag>(static_cast<int>(tags.back()) + n);
    } else {
      tags.emplace_back(static_cast<detail::StackEntryTag>(n));
    }
#if PYCENTAURUS
    values.front() += n;
#else
    for (int i = 0; i < n; i++) {
      values.emplace_back(*values_next_it++);
    }
#endif
  }